

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Token.cpp
# Opt level: O1

String * __thiscall
nigel::Token_StringL::toString_abi_cxx11_
          (String *__return_storage_ptr__,Token_StringL *this,bool extended)

{
  pointer pcVar1;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  pcVar1 = (this->string)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)__return_storage_ptr__,pcVar1,pcVar1 + (this->string)._M_string_length);
  std::__cxx11::string::append((char *)__return_storage_ptr__);
  return __return_storage_ptr__;
}

Assistant:

String Token_StringL::toString( bool extended ) const
	{
		return string + ( extended ? "\t\tas string literal" : "" );
	}